

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_ssm_conv(ggml_context *ctx,ggml_tensor *sx,ggml_tensor *c)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  long local_28;
  long local_20;
  int64_t local_18;
  
  if (sx->ne[3] == 1) {
    if ((c->ne[2] == 1) && (c->ne[3] == 1)) {
      local_28 = c->ne[1];
      if (sx->ne[1] == local_28) {
        local_20 = sx->ne[0] - c->ne[0];
        if (-2 < local_20) {
          local_18 = sx->ne[2];
          local_20 = local_20 + 1;
          pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,3,&local_28,(ggml_tensor *)0x0,0);
          pgVar1->op = GGML_OP_SSM_CONV;
          pgVar1->src[0] = sx;
          pgVar1->src[1] = c;
          return pgVar1;
        }
        pcVar2 = "n_t >= 0";
        line = 0x11c1;
      }
      else {
        pcVar2 = "sx->ne[1] == d_inner";
        line = 0x11c0;
      }
    }
    else {
      pcVar2 = "ggml_is_matrix(c)";
      line = 0x11b6;
    }
  }
  else {
    pcVar2 = "ggml_is_3d(sx)";
    line = 0x11b5;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_ssm_conv(
        struct ggml_context * ctx,
        struct ggml_tensor  * sx,
        struct ggml_tensor  * c) {
    GGML_ASSERT(ggml_is_3d(sx));
    GGML_ASSERT(ggml_is_matrix(c));

    const int64_t d_conv  = c->ne[0];
    const int64_t d_inner = c->ne[1];
    const int64_t n_t     = sx->ne[0] - d_conv + 1; // tokens per sequence
    const int64_t n_s     = sx->ne[2];

    // TODO: maybe support other strides than 1?
    // FIXME: this is always true?
    GGML_ASSERT(sx->ne[0] == d_conv - 1 + n_t);
    GGML_ASSERT(sx->ne[1] == d_inner);
    GGML_ASSERT(n_t >= 0);

    struct ggml_tensor * result = ggml_new_tensor_3d(ctx, GGML_TYPE_F32, d_inner, n_t, n_s);

    result->op     = GGML_OP_SSM_CONV;
    result->src[0] = sx;
    result->src[1] = c;

    return result;
}